

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpserver.c
# Opt level: O0

void uss_rename(SftpServer *srv,SftpReplyBuilder *reply,ptrlen srcpath,ptrlen dstpath)

{
  int iVar1;
  char *__old;
  char *__new;
  int status;
  char *dststr;
  char *srcstr;
  UnixSftpServer *uss;
  SftpReplyBuilder *reply_local;
  SftpServer *srv_local;
  ptrlen dstpath_local;
  ptrlen srcpath_local;
  
  __old = mkstr(srcpath);
  __new = mkstr(dstpath);
  iVar1 = rename(__old,__new);
  free(__old);
  free(__new);
  if (iVar1 < 0) {
    uss_error((UnixSftpServer *)(srv + -6),reply);
  }
  else {
    fxp_reply_ok(reply);
  }
  return;
}

Assistant:

static void uss_rename(SftpServer *srv, SftpReplyBuilder *reply,
                       ptrlen srcpath, ptrlen dstpath)
{
    UnixSftpServer *uss = container_of(srv, UnixSftpServer, srv);

    char *srcstr = mkstr(srcpath), *dststr = mkstr(dstpath);
    int status = rename(srcstr, dststr);
    free(srcstr);
    free(dststr);

    if (status < 0) {
        uss_error(uss, reply);
    } else {
        fxp_reply_ok(reply);
    }
}